

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  REF_INT RVar3;
  REF_GLOB local_40;
  int local_30;
  int local_2c;
  REF_INT edge;
  REF_INT cell_node;
  REF_NODE ref_node;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid->node;
  for (local_30 = 0; local_30 < ref_cell->edge_per; local_30 = local_30 + 1) {
    pRVar2 = ref_subdiv->mark;
    RVar3 = ref_subdiv_c2e(ref_subdiv,ref_cell,local_30,cell);
    printf(" %d",(ulong)(uint)pRVar2[RVar3]);
  }
  printf(" cell %d rank %d",(ulong)(uint)cell,(ulong)(uint)ref_subdiv->grid->mpi->id);
  local_2c = 0;
  do {
    if (ref_cell->node_per <= local_2c) {
      printf("\n");
      return 0;
    }
    if (ref_cell->c2n[local_2c + ref_cell->size_per * cell] < 0) {
LAB_002c5cc9:
      local_40 = -1;
    }
    else {
      if (pRVar1->max <= ref_cell->c2n[local_2c + ref_cell->size_per * cell]) goto LAB_002c5cc9;
      if (pRVar1->global[ref_cell->c2n[local_2c + ref_cell->size_per * cell]] < 0)
      goto LAB_002c5cc9;
      local_40 = pRVar1->global[ref_cell->c2n[local_2c + ref_cell->size_per * cell]];
    }
    printf(" %ld",local_40);
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,
                                           REF_CELL ref_cell, REF_INT cell) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT cell_node, edge;

  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    printf(" %d",
           ref_subdiv_mark(ref_subdiv,
                           ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)));
  }
  printf(" cell %d rank %d", cell, ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)));
  each_ref_cell_cell_node(ref_cell, cell_node) {
    printf(" " REF_GLOB_FMT,
           ref_node_global(ref_node, ref_cell_c2n(ref_cell, cell_node, cell)));
  }
  printf("\n");

  return REF_SUCCESS;
}